

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::RgbaOutputFile::ToYca::writePixels(ToYca *this,int numScanLines)

{
  int j;
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  ArgExc *this_00;
  int iVar4;
  int j_1;
  int iVar5;
  int iVar6;
  bool bVar7;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  if (this->_fbBase != (Rgba *)0x0) {
    if ((this->_writeY == true) && (this->_writeC == false)) {
      if (numScanLines < 1) {
        numScanLines = 0;
      }
      for (iVar4 = 0; iVar4 != numScanLines; iVar4 = iVar4 + 1) {
        for (lVar1 = 0; lVar1 < this->_width; lVar1 = lVar1 + 1) {
          this->_tmpBuf[lVar1] =
               this->_fbBase
               [(long)this->_currentScanLine * this->_fbYStride +
                (this->_xMin + lVar1) * this->_fbXStride];
        }
        RgbaYca::RGBAtoYCA(&this->_yw,this->_width,this->_writeA,this->_tmpBuf,this->_tmpBuf);
        OutputFile::writePixels(this->_outputFile,1);
        this->_linesConverted = this->_linesConverted + 1;
        this->_currentScanLine =
             this->_currentScanLine + (-(uint)(this->_lineOrder != INCREASING_Y) | 1);
      }
    }
    else {
      if (numScanLines < 1) {
        numScanLines = 0;
      }
      for (iVar4 = 0; iVar4 != numScanLines; iVar4 = iVar4 + 1) {
        for (lVar1 = 0; lVar1 < this->_width; lVar1 = lVar1 + 1) {
          this->_tmpBuf[lVar1 + 0xd] =
               this->_fbBase
               [(long)this->_currentScanLine * this->_fbYStride +
                (this->_xMin + lVar1) * this->_fbXStride];
        }
        RgbaYca::RGBAtoYCA(&this->_yw,this->_width,this->_writeA,this->_tmpBuf + 0xd,
                           this->_tmpBuf + 0xd);
        padTmpBuf(this);
        rotateBuffers(this);
        RgbaYca::decimateChromaHoriz(this->_width,this->_tmpBuf,this->_buf[0x1a]);
        iVar5 = this->_linesConverted;
        if (iVar5 == 0) {
          iVar5 = 0xd;
          while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
            duplicateLastBuffer(this);
          }
          iVar5 = this->_linesConverted;
        }
        iVar6 = iVar5 + 1;
        this->_linesConverted = iVar6;
        if (0xc < iVar5) {
          decimateChromaVertAndWriteScanLine(this);
          iVar6 = this->_linesConverted;
        }
        iVar5 = this->_height;
        if (iVar5 <= iVar6) {
          for (iVar6 = 0; iVar6 < 0xd - iVar5; iVar6 = iVar6 + 1) {
            duplicateLastBuffer(this);
            iVar5 = this->_height;
          }
          duplicateSecondToLastBuffer(this);
          this->_linesConverted = this->_linesConverted + 1;
          decimateChromaVertAndWriteScanLine(this);
          iVar5 = 1;
          while( true ) {
            iVar6 = this->_height;
            if (0xc < this->_height) {
              iVar6 = 0xd;
            }
            if (iVar6 <= iVar5) break;
            duplicateLastBuffer(this);
            this->_linesConverted = this->_linesConverted + 1;
            decimateChromaVertAndWriteScanLine(this);
            iVar5 = iVar5 + 1;
          }
        }
        this->_currentScanLine =
             this->_currentScanLine + (-(uint)(this->_lineOrder != INCREASING_Y) | 1);
      }
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_1a8,
                           "No frame buffer was specified as the pixel data source for image file \""
                          );
  pcVar3 = OutputFile::fileName(this->_outputFile);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
RgbaOutputFile::ToYca::writePixels (int numScanLines)
{
    if (_fbBase == 0)
    {
	THROW (IEX_NAMESPACE::ArgExc, "No frame buffer was specified as the "
			    "pixel data source for image file "
			    "\"" << _outputFile.fileName() << "\".");
    }

    if (_writeY && !_writeC)
    {
	//
	// We are writing only luminance; filtering
	// and subsampling are not necessary.
	//

	for (int i = 0; i < numScanLines; ++i)
	{
	    //
	    // Copy the next scan line from the caller's
	    // frame buffer into _tmpBuf.
	    //

	    for (int j = 0; j < _width; ++j)
	    {
		_tmpBuf[j] = _fbBase[_fbYStride * _currentScanLine +
				     _fbXStride * (j + _xMin)];
	    }

	    //
	    // Convert the scan line from RGB to luminance/chroma,
	    // and store the result in the output file.
	    //

	    RGBAtoYCA (_yw, _width, _writeA, _tmpBuf, _tmpBuf);
	    _outputFile.writePixels (1);

	    ++_linesConverted;

	    if (_lineOrder == INCREASING_Y)
		++_currentScanLine;
	    else
		--_currentScanLine;
	}
    }
    else
    {
	//
	// We are writing chroma; the pixels must be filtered and subsampled.
	//

	for (int i = 0; i < numScanLines; ++i)
	{
	    //
	    // Copy the next scan line from the caller's
	    // frame buffer into _tmpBuf.
	    //

	    for (int j = 0; j < _width; ++j)
	    {
		_tmpBuf[j + N2] = _fbBase[_fbYStride * _currentScanLine +
					  _fbXStride * (j + _xMin)];
	    }

	    //
	    // Convert the scan line from RGB to luminance/chroma.
	    //

	    RGBAtoYCA (_yw, _width, _writeA, _tmpBuf + N2, _tmpBuf + N2);

	    //
	    // Append N2 copies of the first and last pixel to the
	    // beginning and end of the scan line.
	    //

	    padTmpBuf ();

	    //
	    // Filter and subsample the scan line's chroma channels
	    // horizontally; store the result in _buf.
	    //

	    rotateBuffers();
	    decimateChromaHoriz (_width, _tmpBuf, _buf[N - 1]);

	    //
	    // If this is the first scan line in the image,
	    // store N2 more copies of the scan line in _buf.
	    //

	    if (_linesConverted == 0)
	    {
		for (int j = 0; j < N2; ++j)
		    duplicateLastBuffer();
	    }

	    ++_linesConverted;

	    //
	    // If we have have converted at least N2 scan lines from
	    // RGBA to luminance/chroma, then we can start to filter
	    // and subsample vertically, and store pixels in the
	    // output file.
	    //

	    if (_linesConverted > N2)
		decimateChromaVertAndWriteScanLine();

	    //
	    // If we have already converted the last scan line in
	    // the image to luminance/chroma, filter, subsample and
	    // store the remaining scan lines in _buf.
	    //

	    if (_linesConverted >= _height)
	    {
		for (int j = 0; j < N2 - _height; ++j)
		    duplicateLastBuffer();

		duplicateSecondToLastBuffer();
		++_linesConverted;
		decimateChromaVertAndWriteScanLine();

		for (int j = 1; j < min (_height, N2); ++j)
		{
		    duplicateLastBuffer();
		    ++_linesConverted;
		    decimateChromaVertAndWriteScanLine();
		}
	    }

	    if (_lineOrder == INCREASING_Y)
		++_currentScanLine;
	    else
		--_currentScanLine;
	}
    }
}